

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O1

bool vkt::texture::anon_unknown_0::verifyTexCompareResult<tcu::TextureCube>
               (TestContext *testCtx,ConstPixelBufferAccess *result,TextureCube *src,float *texCoord
               ,ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec
               ,PixelFormat *pixelFormat)

{
  int *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ChannelType CVar2;
  TestLog *this_00;
  ConstPixelBufferAccess *pCVar3;
  int i;
  int iVar4;
  long lVar5;
  Surface *pSVar6;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ChannelOrder CVar7;
  long lVar8;
  undefined1 local_328 [40];
  float *local_300;
  ReferenceParams *local_2f8;
  Surface reference;
  string local_2d8;
  undefined1 local_2b8 [40];
  Surface errorMask;
  string local_278;
  Vec3 nonShadowThreshold;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  ConstPixelBufferAccess *pCStack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [6];
  TextureCube clampedSource;
  
  this_00 = testCtx->m_log;
  local_300 = texCoord;
  local_2f8 = sampleParams;
  tcu::Surface::Surface(&reference,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  tcu::Surface::Surface(&errorMask,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  local_328._0_4_ = pixelFormat->redBits;
  local_328._4_4_ = pixelFormat->greenBits;
  local_328._8_4_ = pixelFormat->blueBits;
  local_328._12_4_ = pixelFormat->alphaBits;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar5 = 0;
  do {
    res.m_data[lVar5] = *(int *)(local_328 + lVar5 * 4) + -1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  tcu::computeFixedPointThreshold((tcu *)&clampedSource,&res);
  nonShadowThreshold.m_data[2] = (float)clampedSource._12_4_;
  CVar7 = (src->m_format).order;
  CVar2 = (src->m_format).type;
  if ((CVar2 == FLOAT && CVar7 == D) || (CVar2 == FLOAT_UNSIGNED_INT_24_8_REV && CVar7 == DS)) {
    tcu::TextureCube::TextureCube(&clampedSource,src);
    if (0 < (int)((ulong)((long)clampedSource.m_access[0].
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)clampedSource.m_access[0].
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
      lVar5 = 0;
      do {
        lVar8 = 0;
        do {
          clampFloatingPointTexture
                    ((PixelBufferAccess *)
                     (*(long *)((long)&clampedSource.m_access[0].
                                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar8) +
                     lVar5 * 0x28));
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x90);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)((ulong)((long)clampedSource.m_access[0].
                                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)clampedSource.m_access[0].
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x33333333);
    }
    tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)local_328,&reference,pixelFormat);
    local_218[0]._M_allocated_capacity = clampedSource.m_view.m_levels[5];
    local_228._M_p = (pointer)clampedSource.m_view.m_levels[3];
    pCStack_220 = clampedSource.m_view.m_levels[4];
    local_238._M_allocated_capacity = (size_type)clampedSource.m_view.m_levels[1];
    local_238._8_8_ = clampedSource.m_view.m_levels[2];
    res.m_data[0] = clampedSource.m_view.m_numLevels;
    res.m_data[1] = clampedSource.m_view._4_4_;
    res.m_data._8_8_ = clampedSource.m_view.m_levels[0];
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_328,(TextureCubeView *)&res,local_300,local_2f8);
    res.m_data[0] = 8;
    res.m_data[1] = 3;
    if (reference.m_pixels.m_cap != 0) {
      reference.m_pixels.m_cap = (size_t)reference.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_328,(TextureFormat *)&res,reference.m_width,
               reference.m_height,1,(void *)reference.m_pixels.m_cap);
    res.m_data[0] = 8;
    res.m_data[1] = 3;
    if (errorMask.m_pixels.m_cap != 0) {
      errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2b8,(TextureFormat *)&res,errorMask.m_width,
               errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
    local_218[0]._M_allocated_capacity = clampedSource.m_view.m_levels[5];
    local_228._M_p = (pointer)clampedSource.m_view.m_levels[3];
    pCStack_220 = clampedSource.m_view.m_levels[4];
    local_238._M_allocated_capacity = (size_type)clampedSource.m_view.m_levels[1];
    local_238._8_8_ = clampedSource.m_view.m_levels[2];
    res.m_data[0] = clampedSource.m_view.m_numLevels;
    res.m_data[1] = clampedSource.m_view._4_4_;
    res.m_data._8_8_ = clampedSource.m_view.m_levels[0];
    iVar4 = glu::TextureTestUtil::computeTextureCompareDiff
                      (result,(ConstPixelBufferAccess *)local_328,(PixelBufferAccess *)local_2b8,
                       (TextureCubeView *)&res,local_300,local_2f8,comparePrec,lodPrec,
                       &nonShadowThreshold);
    tcu::TextureCube::~TextureCube(&clampedSource);
  }
  else {
    tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&res,&reference,pixelFormat);
    clampedSource.m_data[1].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(src->m_view).m_levels[5];
    pCVar3 = (src->m_view).m_levels[0];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(src->m_view).m_levels[1];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(src->m_view).m_levels[2];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(src->m_view).m_levels[3];
    clampedSource.m_data[1].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(src->m_view).m_levels[4];
    clampedSource.m_format.order = (ChannelOrder)*(undefined8 *)&src->m_view;
    clampedSource.m_format.type = (ChannelType)((ulong)*(undefined8 *)&src->m_view >> 0x20);
    clampedSource.m_size = (int)pCVar3;
    clampedSource._12_4_ = SUB84((ulong)pCVar3 >> 0x20,0);
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)&res,(TextureCubeView *)&clampedSource,local_300,local_2f8);
    clampedSource.m_format.order = RGBA;
    clampedSource.m_format.type = UNORM_INT8;
    if (reference.m_pixels.m_cap != 0) {
      reference.m_pixels.m_cap = (size_t)reference.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res,&clampedSource.m_format,reference.m_width,
               reference.m_height,1,(void *)reference.m_pixels.m_cap);
    clampedSource.m_format.order = RGBA;
    clampedSource.m_format.type = UNORM_INT8;
    if (errorMask.m_pixels.m_cap != 0) {
      errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_328,&clampedSource.m_format,errorMask.m_width,
               errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
    clampedSource.m_data[1].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(src->m_view).m_levels[5];
    pCVar3 = (src->m_view).m_levels[0];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(src->m_view).m_levels[1];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(src->m_view).m_levels[2];
    clampedSource.m_data[0].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(src->m_view).m_levels[3];
    clampedSource.m_data[1].
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(src->m_view).m_levels[4];
    clampedSource.m_format.order = (ChannelOrder)*(undefined8 *)&src->m_view;
    clampedSource.m_format.type = (ChannelType)((ulong)*(undefined8 *)&src->m_view >> 0x20);
    clampedSource.m_size = (int)pCVar3;
    clampedSource._12_4_ = SUB84((ulong)pCVar3 >> 0x20,0);
    iVar4 = glu::TextureTestUtil::computeTextureCompareDiff
                      (result,(ConstPixelBufferAccess *)&res,(PixelBufferAccess *)local_328,
                       (TextureCubeView *)&clampedSource,local_300,local_2f8,comparePrec,lodPrec,
                       &nonShadowThreshold);
  }
  CVar7 = (ChannelOrder)this_00;
  if (0 < iVar4) {
    this = &clampedSource.m_size;
    clampedSource.m_format.type = (ChannelType)((ulong)this_00 >> 0x20);
    clampedSource.m_format.order = CVar7;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"ERROR: Result verification failed, got ",0x27);
    std::ostream::operator<<(this,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&clampedSource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    std::ios_base::~ios_base
              ((ios_base *)
               &clampedSource.m_data[4].
                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_328._0_8_ = (long)local_328 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"VerifyResult","");
  local_2b8._0_8_ = (long)local_2b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_328,(string *)local_2b8);
  tcu::TestLog::startImageSet(this_00,(char *)res.m_data._0_8_,local_228._M_p);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Rendered","");
  paVar1 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Rendered image","");
  tcu::LogImage::LogImage
            ((LogImage *)&clampedSource,&local_2d8,&local_278,result,QP_IMAGE_COMPRESSION_MODE_BEST)
  ;
  tcu::LogImage::write((LogImage *)&clampedSource,CVar7,__buf,(size_t)result);
  if (clampedSource.m_data[0].
      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pointer)&clampedSource.m_data[1].
                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(clampedSource.m_data[0].
                    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (ulong)((long)&(clampedSource.m_data[1].
                                    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->m_ptr + 1));
  }
  if ((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
       *)CONCAT44(clampedSource.m_format.type,clampedSource.m_format.order) != clampedSource.m_data)
  {
    operator_delete((undefined1 *)CONCAT44(clampedSource.m_format.type,clampedSource.m_format.order)
                    ,(ulong)((long)&(clampedSource.m_data[0].
                                     super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_ptr + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_p != local_218) {
    operator_delete(local_228._M_p,(ulong)(local_218[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != &local_238) {
    operator_delete((void *)res.m_data._0_8_,(ulong)(local_238._M_allocated_capacity + 1));
  }
  if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if (local_328._0_8_ != (long)local_328 + 0x10) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  if (0 < iVar4) {
    local_328._0_8_ = (long)local_328 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Reference","");
    local_2b8._0_8_ = (long)local_2b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Ideal reference image","");
    pSVar6 = &reference;
    tcu::LogImage::LogImage
              ((LogImage *)&clampedSource,(string *)local_328,(string *)local_2b8,pSVar6,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&clampedSource,CVar7,__buf_00,(size_t)pSVar6);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"ErrorMask","");
    local_278._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Error mask","");
    pSVar6 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,&local_2d8,&local_278,pSVar6,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,CVar7,__buf_01,(size_t)pSVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p != local_218) {
      operator_delete(local_228._M_p,(ulong)(local_218[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != &local_238) {
      operator_delete((void *)res.m_data._0_8_,(ulong)(local_238._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (clampedSource.m_data[0].
        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)&clampedSource.m_data[1].
                  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      operator_delete(clampedSource.m_data[0].
                      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ulong)((long)&(clampedSource.m_data[1].
                                      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->m_ptr + 1));
    }
    if ((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
         *)CONCAT44(clampedSource.m_format.type,clampedSource.m_format.order) !=
        clampedSource.m_data) {
      operator_delete((undefined1 *)
                      CONCAT44(clampedSource.m_format.type,clampedSource.m_format.order),
                      (ulong)((long)&(clampedSource.m_data[0].
                                      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + 1));
    }
    if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    if (local_328._0_8_ != (long)local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(this_00);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&reference);
  return iVar4 == 0;
}

Assistant:

bool verifyTexCompareResult (tcu::TestContext&						testCtx,
							 const tcu::ConstPixelBufferAccess&		result,
							 const TextureType&						src,
							 const float*							texCoord,
							 const ReferenceParams&					sampleParams,
							 const tcu::TexComparePrecision&		comparePrec,
							 const tcu::LodPrecision&				lodPrec,
							 const tcu::PixelFormat&				pixelFormat)
{
	tcu::TestLog&	log					= testCtx.getLog();
	tcu::Surface	reference			(result.getWidth(), result.getHeight());
	tcu::Surface	errorMask			(result.getWidth(), result.getHeight());
	const tcu::Vec3	nonShadowThreshold	= tcu::computeFixedPointThreshold(getBitsVec(pixelFormat)-1).swizzle(1,2,3);
	int				numFailedPixels;

	// sampleTexture() expects source image to be the same state as it would be in a GL implementation, that is
	// the floating point depth values should be in [0, 1] range as data is clamped during texture upload. Since
	// we don't have a separate "uploading" phase and just reuse the buffer we used for GL-upload, do the clamping
	// here if necessary.

	if (isFloatingPointDepthFormat(src.getFormat()))
	{
		TextureType clampedSource(src);

		clampFloatingPointTexture(clampedSource);

		// sample clamped values

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), clampedSource, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), clampedSource, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}
	else
	{
		// sample raw values (they are guaranteed to be in [0, 1] range as the format cannot represent any other values)

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), src, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), src, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}

	if (numFailedPixels > 0)
		log << TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("Reference", "Ideal reference image", reference)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return numFailedPixels == 0;
}